

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_fxload(ASMState *as,IRIns *ir)

{
  Reg rr;
  uint uVar1;
  RegSet allow;
  x86Op xo;
  
  allow = 0xbfef;
  if ((byte)(((ir->field_1).t.irt & 0x1f) - 0xd) < 2) {
    allow = 0xffff0000;
  }
  rr = ra_dest(as,ir,allow);
  if ((ir->field_1).o == 'E') {
    asm_fusefref(as,ir,0xbfef);
  }
  else {
    asm_fusexref(as,(uint)(ir->field_0).op1,0xbfef);
  }
  uVar1 = (ir->field_1).t.irt & 0x1f;
  switch(uVar1) {
  case 0xd:
    xo = XO_MOVSS;
    break;
  case 0xe:
    xo = XO_MOVSD;
    break;
  case 0xf:
    xo = XO_MOVSXb;
    break;
  case 0x10:
    xo = XO_MOVZXb;
    break;
  case 0x11:
    xo = XO_MOVSXw;
    break;
  case 0x12:
    xo = XO_MOVZXw;
    break;
  default:
    if ((0x605fd9U >> uVar1 & 1) != 0) {
      rr = rr | 0x80200;
    }
    xo = XO_MOV;
  }
  emit_mrm(as,xo,rr,0x20);
  return;
}

Assistant:

static void asm_fxload(ASMState *as, IRIns *ir)
{
  Reg dest = ra_dest(as, ir, irt_isfp(ir->t) ? RSET_FPR : RSET_GPR);
  x86Op xo;
  if (ir->o == IR_FLOAD)
    asm_fusefref(as, ir, RSET_GPR);
  else
    asm_fusexref(as, ir->op1, RSET_GPR);
  /* ir->op2 is ignored -- unaligned loads are ok on x86. */
  switch (irt_type(ir->t)) {
  case IRT_I8: xo = XO_MOVSXb; break;
  case IRT_U8: xo = XO_MOVZXb; break;
  case IRT_I16: xo = XO_MOVSXw; break;
  case IRT_U16: xo = XO_MOVZXw; break;
  case IRT_NUM: xo = XO_MOVSD; break;
  case IRT_FLOAT: xo = XO_MOVSS; break;
  default:
    if (LJ_64 && irt_is64(ir->t))
      dest |= REX_64;
    else
      lj_assertA(irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t),
		 "unsplit 64 bit load");
    xo = XO_MOV;
    break;
  }
  emit_mrm(as, xo, dest, RID_MRM);
}